

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFObjectHandle::parse
          (QPDFObjectHandle *this,QPDF *context,string *object_str,string *object_description)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  QPDFExc *this_00;
  qpdf_offset_t offset_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar5;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  qpdf_offset_t local_160;
  ulong local_158;
  size_t offset;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  BufferInputSource input;
  Buffer buf;
  string *object_description_local;
  string *object_str_local;
  QPDF *context_local;
  QPDFObjectHandle *result;
  
  Buffer::Buffer((Buffer *)&input.max_offset,object_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"parsed object",&local_139);
  BufferInputSource::BufferInputSource
            ((BufferInputSource *)local_118,&local_138,(Buffer *)&input.max_offset,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  offset._3_1_ = 0;
  QPDFParser::parse((QPDFParser *)this,(InputSource *)local_118,object_description,context);
  local_160 = BufferInputSource::tell((BufferInputSource *)local_118);
  local_158 = QIntC::to_size<long_long>(&local_160);
  while( true ) {
    uVar1 = local_158;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar1) {
      offset._3_1_ = 1;
      BufferInputSource::~BufferInputSource((BufferInputSource *)local_118);
      Buffer::~Buffer((Buffer *)&input.max_offset);
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (QPDFObjectHandle)
             QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
    pcVar4 = (char *)std::__cxx11::string::at((ulong)object_str);
    iVar2 = isspace((int)*pcVar4);
    if (iVar2 == 0) break;
    local_158 = local_158 + 1;
  }
  QTC::TC("qpdf","QPDFObjectHandle trailing data in parse",0);
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"parsed object",&local_181);
  offset_00 = InputSource::getLastOffset((InputSource *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"trailing data found parsing object from string",&local_1a9);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_180,object_description,offset_00,&local_1a8);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::parse(
    QPDF* context, std::string const& object_str, std::string const& object_description)
{
    // BufferInputSource does not modify the input, but Buffer either requires a string& or copies
    // the string.
    Buffer buf(const_cast<std::string&>(object_str));
    auto input = BufferInputSource("parsed object", &buf);
    auto result = QPDFParser::parse(input, object_description, context);
    size_t offset = QIntC::to_size(input.tell());
    while (offset < object_str.length()) {
        if (!isspace(object_str.at(offset))) {
            QTC::TC("qpdf", "QPDFObjectHandle trailing data in parse");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "parsed object",
                object_description,
                input.getLastOffset(),
                "trailing data found parsing object from string");
        }
        ++offset;
    }
    return result;
}